

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_pcm_frames_f32(drwav *pWav,drwav_uint64 framesToRead,float *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  byte *pbVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float *pfVar13;
  undefined8 *puVar14;
  ulong uVar15;
  drwav_uint64 dVar16;
  float fVar17;
  drwav_int16 samples16 [2048];
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (drwav *)0x0) {
    dVar16 = 0;
  }
  else {
    if (pBufferOut == (float *)0x0) {
      dVar16 = drwav_read_pcm_frames_le(pWav,framesToRead,(void *)0x0);
      return dVar16;
    }
    dVar16 = 0;
    switch(pWav->translatedFormatTag) {
    case 1:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar7 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar7 = (uint)(pWav->fmt).blockAlign;
      }
      dVar16 = 0;
      if (uVar7 != 0) {
        dVar16 = 0;
        do {
          uVar8 = 0x1000 / (ulong)uVar7;
          if (framesToRead < 0x1000 / (ulong)uVar7) {
            uVar8 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_le(pWav,uVar8,&local_1038);
          if (dVar3 == 0) {
            return dVar16;
          }
          uVar1 = pWav->channels;
          uVar5 = dVar3 * uVar1;
          uVar8 = (ulong)uVar7 / (ulong)uVar1;
          uVar2 = (uint)uVar8;
          switch(uVar2) {
          case 1:
            if (uVar5 != 0 && pBufferOut != (float *)0x0) {
              lVar9 = 0;
              do {
                pBufferOut[lVar9] = (float)*(byte *)((long)&local_1038 + lVar9) * 0.007843138 + -1.0
                ;
                lVar9 = lVar9 + 1;
              } while (uVar5 - lVar9 != 0);
            }
            break;
          case 2:
            if (uVar5 != 0 && pBufferOut != (float *)0x0) {
              lVar9 = 0;
              do {
                pBufferOut[lVar9] =
                     (float)(int)*(short *)((long)&local_1038 + lVar9 * 2) * 3.0517578e-05;
                lVar9 = lVar9 + 1;
              } while (uVar5 - lVar9 != 0);
            }
            break;
          case 3:
            if (uVar5 != 0 && pBufferOut != (float *)0x0) {
              pbVar4 = (byte *)((long)&local_1038 + 2);
              lVar9 = 0;
              do {
                pBufferOut[lVar9] =
                     (float)((int)((uint)*pbVar4 << 0x18 | (uint)*(ushort *)(pbVar4 + -2) << 8) >> 8
                            ) * 1.1920929e-07;
                lVar9 = lVar9 + 1;
                pbVar4 = pbVar4 + 3;
              } while (uVar5 - lVar9 != 0);
            }
            break;
          case 4:
            if (uVar5 != 0 && pBufferOut != (float *)0x0) {
              lVar9 = 0;
              do {
                pBufferOut[lVar9] = (float)*(int *)((long)&local_1038 + lVar9 * 4) * 4.656613e-10;
                lVar9 = lVar9 + 1;
              } while (uVar5 - lVar9 != 0);
            }
            break;
          default:
            if (uVar2 < 9) {
              if (uVar5 == 0) {
                uVar5 = 0;
              }
              else {
                uVar12 = 0;
                puVar14 = &local_1038;
                pfVar13 = pBufferOut;
                do {
                  if (uVar7 < uVar1) {
                    fVar17 = 0.0;
                    uVar10 = 0;
                  }
                  else {
                    uVar15 = 0;
                    uVar10 = 0;
                    iVar6 = uVar2 * -8 + 0x40;
                    do {
                      uVar10 = uVar10 | (ulong)*(byte *)((long)puVar14 + uVar15) <<
                                        ((byte)iVar6 & 0x3f);
                      iVar6 = iVar6 + 8;
                      uVar15 = uVar15 + 1;
                    } while (uVar8 != uVar15);
                    fVar17 = (float)((double)(long)uVar10 * 1.0842021724855044e-19);
                    uVar10 = uVar8;
                  }
                  puVar14 = (undefined8 *)((long)puVar14 + uVar10);
                  *pfVar13 = fVar17;
                  pfVar13 = pfVar13 + 1;
                  uVar12 = (ulong)((int)uVar12 + 1);
                } while (uVar12 <= uVar5 && uVar5 - uVar12 != 0);
              }
            }
            else {
              memset(pBufferOut,0,uVar5 * 4);
              uVar5 = pWav->channels * dVar3;
            }
          }
          pBufferOut = pBufferOut + uVar5;
          dVar16 = dVar16 + dVar3;
          framesToRead = framesToRead - dVar3;
        } while (framesToRead != 0);
      }
      break;
    case 2:
      uVar8 = (ulong)pWav->channels;
      dVar16 = 0;
      do {
        uVar8 = (ulong)(ushort)(0x800 / (ushort)uVar8);
        if (framesToRead < uVar8) {
          uVar8 = framesToRead;
        }
        dVar3 = drwav_read_pcm_frames_s16(pWav,uVar8,(drwav_int16 *)&local_1038);
        if (dVar3 == 0) {
          return dVar16;
        }
        uVar8 = (ulong)pWav->channels;
        lVar9 = dVar3 * uVar8;
        if (lVar9 != 0 && pBufferOut != (float *)0x0) {
          lVar11 = 0;
          do {
            pBufferOut[lVar11] =
                 (float)(int)*(short *)((long)&local_1038 + lVar11 * 2) * 3.0517578e-05;
            lVar11 = lVar11 + 1;
          } while (lVar9 - lVar11 != 0);
        }
        pBufferOut = pBufferOut + lVar9;
        dVar16 = dVar16 + dVar3;
        framesToRead = framesToRead - dVar3;
      } while (framesToRead != 0);
      break;
    case 3:
      uVar1 = pWav->bitsPerSample;
      if (uVar1 == 0x20) {
        dVar16 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
      }
      else {
        if ((uVar1 & 7) == 0) {
          uVar7 = (uint)(pWav->fmt).channels * (uint)uVar1 >> 3;
        }
        else {
          uVar7 = (uint)(pWav->fmt).blockAlign;
        }
        dVar3 = 0;
        dVar16 = 0;
        if (uVar7 != 0) {
          do {
            uVar8 = 0x1000 / (ulong)uVar7;
            if (framesToRead < 0x1000 / (ulong)uVar7) {
              uVar8 = framesToRead;
            }
            dVar16 = drwav_read_pcm_frames_le(pWav,uVar8,&local_1038);
            if (dVar16 == 0) {
              return dVar3;
            }
            uVar8 = dVar16 * pWav->channels;
            uVar2 = uVar7 / pWav->channels;
            if (uVar2 == 8) {
              if (uVar8 != 0 && pBufferOut != (float *)0x0) {
                lVar9 = 0;
                do {
                  pBufferOut[lVar9] = (float)(double)(&local_1038)[lVar9];
                  lVar9 = lVar9 + 1;
                } while (uVar8 - lVar9 != 0);
              }
            }
            else if (uVar2 == 4) {
              if (uVar8 == 0) {
                uVar8 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  pBufferOut[uVar5] = *(float *)((long)&local_1038 + uVar5 * 4);
                  uVar5 = uVar5 + 1;
                } while ((uVar5 & 0xffffffff) <= uVar8 && uVar8 - (uVar5 & 0xffffffff) != 0);
              }
            }
            else {
              memset(pBufferOut,0,uVar8 * 4);
              uVar8 = pWav->channels * dVar16;
            }
            pBufferOut = pBufferOut + uVar8;
            dVar3 = dVar3 + dVar16;
            framesToRead = framesToRead - dVar16;
            dVar16 = dVar3;
          } while (framesToRead != 0);
        }
      }
      break;
    case 4:
    case 5:
      break;
    case 6:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar7 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar7 = (uint)(pWav->fmt).blockAlign;
      }
      dVar3 = 0;
      dVar16 = 0;
      if (uVar7 != 0) {
        do {
          uVar8 = 0x1000 / (ulong)uVar7;
          if (framesToRead < 0x1000 / (ulong)uVar7) {
            uVar8 = framesToRead;
          }
          dVar16 = drwav_read_pcm_frames_le(pWav,uVar8,&local_1038);
          if (dVar16 == 0) {
            return dVar3;
          }
          lVar9 = pWav->channels * dVar16;
          if (lVar9 != 0 && pBufferOut != (float *)0x0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] =
                   (float)(int)(short)g_drwavAlawTable[*(byte *)((long)&local_1038 + lVar11)] *
                   3.0517578e-05;
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          dVar3 = dVar3 + dVar16;
          framesToRead = framesToRead - dVar16;
          dVar16 = dVar3;
        } while (framesToRead != 0);
      }
      break;
    case 7:
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar7 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar7 = (uint)(pWav->fmt).blockAlign;
      }
      dVar16 = 0;
      if (uVar7 != 0) {
        do {
          uVar8 = 0x1000 / (ulong)uVar7;
          if (framesToRead < 0x1000 / (ulong)uVar7) {
            uVar8 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_le(pWav,uVar8,&local_1038);
          if (dVar3 == 0) {
            return dVar16;
          }
          lVar9 = pWav->channels * dVar3;
          if (lVar9 != 0 && pBufferOut != (float *)0x0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] =
                   (float)(int)(short)g_drwavMulawTable[*(byte *)((long)&local_1038 + lVar11)] *
                   3.0517578e-05;
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          dVar16 = dVar16 + dVar3;
          framesToRead = framesToRead - dVar3;
        } while (framesToRead != 0);
      }
      break;
    default:
      if (pWav->translatedFormatTag == 0x11) {
        uVar8 = (ulong)pWav->channels;
        dVar16 = 0;
        do {
          uVar8 = (ulong)(ushort)(0x800 / (ushort)uVar8);
          if (framesToRead < uVar8) {
            uVar8 = framesToRead;
          }
          dVar3 = drwav_read_pcm_frames_s16(pWav,uVar8,(drwav_int16 *)&local_1038);
          if (dVar3 == 0) {
            return dVar16;
          }
          uVar8 = (ulong)pWav->channels;
          lVar9 = dVar3 * uVar8;
          if (lVar9 != 0 && pBufferOut != (float *)0x0) {
            lVar11 = 0;
            do {
              pBufferOut[lVar11] =
                   (float)(int)*(short *)((long)&local_1038 + lVar11 * 2) * 3.0517578e-05;
              lVar11 = lVar11 + 1;
            } while (lVar9 - lVar11 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          dVar16 = dVar16 + dVar3;
          framesToRead = framesToRead - dVar3;
        } while (framesToRead != 0);
      }
    }
  }
  return dVar16;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_f32(drwav* pWav, drwav_uint64 framesToRead, float* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(float) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(float) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_f32__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_f32__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_f32__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_f32__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_f32__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_f32__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}